

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testfile.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  SDL_RWops *pSVar2;
  long lVar3;
  undefined4 in_register_0000003c;
  char *ctx;
  undefined1 local_48 [8];
  char test_buf [30];
  SDL_RWops *rwops;
  char **argv_local;
  int argc_local;
  
  cleanup((EVP_PKEY_CTX *)CONCAT44(in_register_0000003c,argc));
  pSVar2 = (SDL_RWops *)SDL_RWFromFile(0);
  if (pSVar2 != (SDL_RWops *)0x0) {
    rwops_error_quit(0x37,pSVar2);
  }
  pSVar2 = (SDL_RWops *)SDL_RWFromFile(0,"ab+");
  if (pSVar2 != (SDL_RWops *)0x0) {
    rwops_error_quit(0x39,pSVar2);
  }
  pSVar2 = (SDL_RWops *)SDL_RWFromFile(0,"sldfkjsldkfj");
  if (pSVar2 != (SDL_RWops *)0x0) {
    rwops_error_quit(0x3b,pSVar2);
  }
  pSVar2 = (SDL_RWops *)SDL_RWFromFile("something","");
  if (pSVar2 != (SDL_RWops *)0x0) {
    rwops_error_quit(0x3d,pSVar2);
  }
  pSVar2 = (SDL_RWops *)SDL_RWFromFile("something",0);
  if (pSVar2 != (SDL_RWops *)0x0) {
    rwops_error_quit(0x3f,pSVar2);
  }
  printf("test1 OK\n");
  pSVar2 = (SDL_RWops *)SDL_RWFromFile("sdldata2","rb");
  if (pSVar2 != (SDL_RWops *)0x0) {
    rwops_error_quit(0x48,pSVar2);
  }
  pSVar2 = (SDL_RWops *)SDL_RWFromFile("sdldata2","rb+");
  if (pSVar2 != (SDL_RWops *)0x0) {
    rwops_error_quit(0x4a,pSVar2);
  }
  lVar3 = SDL_RWFromFile("sdldata2","wb");
  if (lVar3 == 0) {
    rwops_error_quit(0x4c,(SDL_RWops *)0x0);
  }
  (**(code **)(lVar3 + 0x18))(lVar3);
  unlink("sdldata2");
  lVar3 = SDL_RWFromFile("sdldata2","wb+");
  if (lVar3 == 0) {
    rwops_error_quit(0x4f,(SDL_RWops *)0x0);
  }
  (**(code **)(lVar3 + 0x18))(lVar3);
  unlink("sdldata2");
  lVar3 = SDL_RWFromFile("sdldata2","ab");
  if (lVar3 == 0) {
    rwops_error_quit(0x52,(SDL_RWops *)0x0);
  }
  (**(code **)(lVar3 + 0x18))(lVar3);
  unlink("sdldata2");
  lVar3 = SDL_RWFromFile("sdldata2","ab+");
  if (lVar3 == 0) {
    rwops_error_quit(0x55,(SDL_RWops *)0x0);
  }
  (**(code **)(lVar3 + 0x18))(lVar3);
  unlink("sdldata2");
  printf("test2 OK\n");
  pSVar2 = (SDL_RWops *)SDL_RWFromFile("sdldata1","wb");
  if (pSVar2 == (SDL_RWops *)0x0) {
    rwops_error_quit(0x5d,(SDL_RWops *)0x0);
  }
  iVar1 = (*pSVar2->write)(pSVar2,"1234567890",10,1);
  if (iVar1 != 1) {
    rwops_error_quit(0x5e,pSVar2);
  }
  iVar1 = (*pSVar2->write)(pSVar2,"1234567890",1,10);
  if (iVar1 != 10) {
    rwops_error_quit(0x5f,pSVar2);
  }
  iVar1 = (*pSVar2->write)(pSVar2,"1234567",1,7);
  if (iVar1 != 7) {
    rwops_error_quit(0x60,pSVar2);
  }
  iVar1 = (*pSVar2->seek)(pSVar2,0,0);
  if (iVar1 != 0) {
    rwops_error_quit(0x61,pSVar2);
  }
  iVar1 = (*pSVar2->read)(pSVar2,local_48,1,1);
  if (iVar1 != 0) {
    rwops_error_quit(0x62,pSVar2);
  }
  (*pSVar2->close)(pSVar2);
  pSVar2 = (SDL_RWops *)SDL_RWFromFile("sdldata1","rb");
  if (pSVar2 == (SDL_RWops *)0x0) {
    rwops_error_quit(0x66,(SDL_RWops *)0x0);
  }
  iVar1 = (*pSVar2->seek)(pSVar2,0,0);
  if (iVar1 != 0) {
    rwops_error_quit(0x67,pSVar2);
  }
  iVar1 = (*pSVar2->seek)(pSVar2,-7,2);
  if (iVar1 != 0x14) {
    rwops_error_quit(0x68,pSVar2);
  }
  iVar1 = (*pSVar2->read)(pSVar2,local_48,1,7);
  if (iVar1 != 7) {
    rwops_error_quit(0x69,pSVar2);
  }
  iVar1 = memcmp(local_48,"1234567",7);
  if (iVar1 != 0) {
    rwops_error_quit(0x6a,pSVar2);
  }
  iVar1 = (*pSVar2->read)(pSVar2,local_48,1,1);
  if (iVar1 != 0) {
    rwops_error_quit(0x6b,pSVar2);
  }
  iVar1 = (*pSVar2->read)(pSVar2,local_48,10,100);
  if (iVar1 != 0) {
    rwops_error_quit(0x6c,pSVar2);
  }
  iVar1 = (*pSVar2->seek)(pSVar2,-0x1b,1);
  if (iVar1 != 0) {
    rwops_error_quit(0x6d,pSVar2);
  }
  iVar1 = (*pSVar2->read)(pSVar2,local_48,10,3);
  if (iVar1 != 2) {
    rwops_error_quit(0x6e,pSVar2);
  }
  iVar1 = memcmp(local_48,"12345678901234567890",0x14);
  if (iVar1 != 0) {
    rwops_error_quit(0x6f,pSVar2);
  }
  iVar1 = (*pSVar2->write)(pSVar2,local_48,1,1);
  if (iVar1 != 0) {
    rwops_error_quit(0x70,pSVar2);
  }
  (*pSVar2->close)(pSVar2);
  pSVar2 = (SDL_RWops *)SDL_RWFromFile("sdldata1","wb+");
  if (pSVar2 == (SDL_RWops *)0x0) {
    rwops_error_quit(0x75,(SDL_RWops *)0x0);
  }
  iVar1 = (*pSVar2->write)(pSVar2,"1234567890",10,1);
  if (iVar1 != 1) {
    rwops_error_quit(0x76,pSVar2);
  }
  iVar1 = (*pSVar2->write)(pSVar2,"1234567890",1,10);
  if (iVar1 != 10) {
    rwops_error_quit(0x77,pSVar2);
  }
  iVar1 = (*pSVar2->write)(pSVar2,"1234567",1,7);
  if (iVar1 != 7) {
    rwops_error_quit(0x78,pSVar2);
  }
  iVar1 = (*pSVar2->seek)(pSVar2,0,0);
  if (iVar1 != 0) {
    rwops_error_quit(0x79,pSVar2);
  }
  iVar1 = (*pSVar2->read)(pSVar2,local_48,1,1);
  if (iVar1 != 1) {
    rwops_error_quit(0x7a,pSVar2);
  }
  iVar1 = (*pSVar2->seek)(pSVar2,0,0);
  if (iVar1 != 0) {
    rwops_error_quit(0x7b,pSVar2);
  }
  iVar1 = (*pSVar2->seek)(pSVar2,-7,2);
  if (iVar1 != 0x14) {
    rwops_error_quit(0x7c,pSVar2);
  }
  iVar1 = (*pSVar2->read)(pSVar2,local_48,1,7);
  if (iVar1 != 7) {
    rwops_error_quit(0x7d,pSVar2);
  }
  iVar1 = memcmp(local_48,"1234567",7);
  if (iVar1 != 0) {
    rwops_error_quit(0x7e,pSVar2);
  }
  iVar1 = (*pSVar2->read)(pSVar2,local_48,1,1);
  if (iVar1 != 0) {
    rwops_error_quit(0x7f,pSVar2);
  }
  iVar1 = (*pSVar2->read)(pSVar2,local_48,10,100);
  if (iVar1 != 0) {
    rwops_error_quit(0x80,pSVar2);
  }
  iVar1 = (*pSVar2->seek)(pSVar2,-0x1b,1);
  if (iVar1 != 0) {
    rwops_error_quit(0x81,pSVar2);
  }
  iVar1 = (*pSVar2->read)(pSVar2,local_48,10,3);
  if (iVar1 != 2) {
    rwops_error_quit(0x82,pSVar2);
  }
  iVar1 = memcmp(local_48,"12345678901234567890",0x14);
  if (iVar1 != 0) {
    rwops_error_quit(0x83,pSVar2);
  }
  (*pSVar2->close)(pSVar2);
  printf("test3 OK\n");
  pSVar2 = (SDL_RWops *)SDL_RWFromFile("sdldata1","rb+");
  if (pSVar2 == (SDL_RWops *)0x0) {
    rwops_error_quit(0x89,(SDL_RWops *)0x0);
  }
  iVar1 = (*pSVar2->write)(pSVar2,"1234567890",10,1);
  if (iVar1 != 1) {
    rwops_error_quit(0x8a,pSVar2);
  }
  iVar1 = (*pSVar2->write)(pSVar2,"1234567890",1,10);
  if (iVar1 != 10) {
    rwops_error_quit(0x8b,pSVar2);
  }
  iVar1 = (*pSVar2->write)(pSVar2,"1234567",1,7);
  if (iVar1 != 7) {
    rwops_error_quit(0x8c,pSVar2);
  }
  iVar1 = (*pSVar2->seek)(pSVar2,0,0);
  if (iVar1 != 0) {
    rwops_error_quit(0x8d,pSVar2);
  }
  iVar1 = (*pSVar2->read)(pSVar2,local_48,1,1);
  if (iVar1 != 1) {
    rwops_error_quit(0x8e,pSVar2);
  }
  iVar1 = (*pSVar2->seek)(pSVar2,0,0);
  if (iVar1 != 0) {
    rwops_error_quit(0x8f,pSVar2);
  }
  iVar1 = (*pSVar2->seek)(pSVar2,-7,2);
  if (iVar1 != 0x14) {
    rwops_error_quit(0x90,pSVar2);
  }
  iVar1 = (*pSVar2->read)(pSVar2,local_48,1,7);
  if (iVar1 != 7) {
    rwops_error_quit(0x91,pSVar2);
  }
  iVar1 = memcmp(local_48,"1234567",7);
  if (iVar1 != 0) {
    rwops_error_quit(0x92,pSVar2);
  }
  iVar1 = (*pSVar2->read)(pSVar2,local_48,1,1);
  if (iVar1 != 0) {
    rwops_error_quit(0x93,pSVar2);
  }
  iVar1 = (*pSVar2->read)(pSVar2,local_48,10,100);
  if (iVar1 != 0) {
    rwops_error_quit(0x94,pSVar2);
  }
  iVar1 = (*pSVar2->seek)(pSVar2,-0x1b,1);
  if (iVar1 != 0) {
    rwops_error_quit(0x95,pSVar2);
  }
  iVar1 = (*pSVar2->read)(pSVar2,local_48,10,3);
  if (iVar1 != 2) {
    rwops_error_quit(0x96,pSVar2);
  }
  iVar1 = memcmp(local_48,"12345678901234567890",0x14);
  if (iVar1 != 0) {
    rwops_error_quit(0x97,pSVar2);
  }
  (*pSVar2->close)(pSVar2);
  printf("test4 OK\n");
  pSVar2 = (SDL_RWops *)SDL_RWFromFile("sdldata1","ab+");
  if (pSVar2 == (SDL_RWops *)0x0) {
    rwops_error_quit(0x9d,(SDL_RWops *)0x0);
  }
  iVar1 = (*pSVar2->write)(pSVar2,"1234567890",10,1);
  if (iVar1 != 1) {
    rwops_error_quit(0x9e,pSVar2);
  }
  iVar1 = (*pSVar2->write)(pSVar2,"1234567890",1,10);
  if (iVar1 != 10) {
    rwops_error_quit(0x9f,pSVar2);
  }
  iVar1 = (*pSVar2->write)(pSVar2,"1234567",1,7);
  if (iVar1 != 7) {
    rwops_error_quit(0xa0,pSVar2);
  }
  iVar1 = (*pSVar2->seek)(pSVar2,0,0);
  if (iVar1 != 0) {
    rwops_error_quit(0xa1,pSVar2);
  }
  iVar1 = (*pSVar2->read)(pSVar2,local_48,1,1);
  if (iVar1 != 1) {
    rwops_error_quit(0xa3,pSVar2);
  }
  iVar1 = (*pSVar2->seek)(pSVar2,0,0);
  if (iVar1 != 0) {
    rwops_error_quit(0xa4,pSVar2);
  }
  iVar1 = (*pSVar2->seek)(pSVar2,-7,2);
  if (iVar1 != 0x2f) {
    rwops_error_quit(0xa6,pSVar2);
  }
  iVar1 = (*pSVar2->read)(pSVar2,local_48,1,7);
  if (iVar1 != 7) {
    rwops_error_quit(0xa7,pSVar2);
  }
  iVar1 = memcmp(local_48,"1234567",7);
  if (iVar1 != 0) {
    rwops_error_quit(0xa8,pSVar2);
  }
  iVar1 = (*pSVar2->read)(pSVar2,local_48,1,1);
  if (iVar1 != 0) {
    rwops_error_quit(0xa9,pSVar2);
  }
  iVar1 = (*pSVar2->read)(pSVar2,local_48,10,100);
  if (iVar1 != 0) {
    rwops_error_quit(0xaa,pSVar2);
  }
  iVar1 = (*pSVar2->seek)(pSVar2,-0x1b,1);
  if (iVar1 != 0x1b) {
    rwops_error_quit(0xac,pSVar2);
  }
  iVar1 = (*pSVar2->seek)(pSVar2,0,0);
  if (iVar1 != 0) {
    rwops_error_quit(0xae,pSVar2);
  }
  iVar1 = (*pSVar2->read)(pSVar2,local_48,10,3);
  if (iVar1 != 3) {
    rwops_error_quit(0xaf,pSVar2);
  }
  iVar1 = memcmp(local_48,"123456789012345678901234567123",0x1e);
  if (iVar1 != 0) {
    rwops_error_quit(0xb1,pSVar2);
  }
  (*pSVar2->close)(pSVar2);
  ctx = "test5 OK\n";
  printf("test5 OK\n");
  cleanup((EVP_PKEY_CTX *)ctx);
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
	SDL_RWops *rwops = NULL;
	char test_buf[30];
	
	cleanup();

/* test 1 : basic argument test: all those calls to SDL_RWFromFile should fail */
	
	rwops = SDL_RWFromFile(NULL,NULL);
	if (rwops) RWOP_ERR_QUIT(rwops);
	rwops = SDL_RWFromFile(NULL,"ab+");
	if (rwops) RWOP_ERR_QUIT(rwops);
	rwops = SDL_RWFromFile(NULL,"sldfkjsldkfj");
	if (rwops) RWOP_ERR_QUIT(rwops);
	rwops = SDL_RWFromFile("something","");
	if (rwops) RWOP_ERR_QUIT(rwops);
	rwops = SDL_RWFromFile("something",NULL);
	if (rwops) RWOP_ERR_QUIT(rwops);	
	printf("test1 OK\n");

/* test 2 : check that inexistant file is not successfully opened/created when required */
/* modes : r, r+ implie that file MUST exist 
   modes : a, a+, w, w+ checks that it succeeds (file may not exists)
   
 */
	rwops = SDL_RWFromFile(FBASENAME2,"rb"); /* this file doesn't exist that call must fail */
	if (rwops) RWOP_ERR_QUIT(rwops);
	rwops = SDL_RWFromFile(FBASENAME2,"rb+"); /* this file doesn't exist that call must fail */
	if (rwops) RWOP_ERR_QUIT(rwops);
	rwops = SDL_RWFromFile(FBASENAME2,"wb");
	if (!rwops) RWOP_ERR_QUIT(rwops); 
	rwops->close(rwops); unlink(FBASENAME2);
	rwops = SDL_RWFromFile(FBASENAME2,"wb+");
	if (!rwops) RWOP_ERR_QUIT(rwops); 
	rwops->close(rwops); unlink(FBASENAME2);
	rwops = SDL_RWFromFile(FBASENAME2,"ab"); 
	if (!rwops) RWOP_ERR_QUIT(rwops); 
	rwops->close(rwops); unlink(FBASENAME2);
	rwops = SDL_RWFromFile(FBASENAME2,"ab+");
	if (!rwops) RWOP_ERR_QUIT(rwops); 
	rwops->close(rwops); unlink(FBASENAME2);
	printf("test2 OK\n");

/* test 3 : creation, writing , reading, seeking, 
	        test : w mode, r mode, w+ mode
 */
	rwops = SDL_RWFromFile(FBASENAME1,"wb"); /* write only */	
	if (!rwops)											RWOP_ERR_QUIT(rwops);
	if (1 != rwops->write(rwops,"1234567890",10,1) )	RWOP_ERR_QUIT(rwops);		
	if (10 != rwops->write(rwops,"1234567890",1,10) )	RWOP_ERR_QUIT(rwops);		
	if (7 != rwops->write(rwops,"1234567",1,7) )		RWOP_ERR_QUIT(rwops);		
	if (0!=rwops->seek(rwops,0L,RW_SEEK_SET))			RWOP_ERR_QUIT(rwops);					
	if (0!=rwops->read(rwops,test_buf,1,1))				RWOP_ERR_QUIT(rwops); /* we are in write only mode */
	rwops->close(rwops);

	rwops = SDL_RWFromFile(FBASENAME1,"rb"); /* read mode, file must exists */
	if (!rwops)											RWOP_ERR_QUIT(rwops);
	if (0!=rwops->seek(rwops,0L,RW_SEEK_SET))			RWOP_ERR_QUIT(rwops);					
	if (20!=rwops->seek(rwops,-7,RW_SEEK_END))			RWOP_ERR_QUIT(rwops);					
	if (7!=rwops->read(rwops,test_buf,1,7))				RWOP_ERR_QUIT(rwops);		
	if (SDL_memcmp(test_buf,"1234567",7))				RWOP_ERR_QUIT(rwops);		
	if (0!=rwops->read(rwops,test_buf,1,1))				RWOP_ERR_QUIT(rwops);		
	if (0!=rwops->read(rwops,test_buf,10,100))			RWOP_ERR_QUIT(rwops);		
	if (0!=rwops->seek(rwops,-27,RW_SEEK_CUR))			RWOP_ERR_QUIT(rwops);		
	if (2!=rwops->read(rwops,test_buf,10,3))			RWOP_ERR_QUIT(rwops);				
	if (SDL_memcmp(test_buf,"12345678901234567890",20))	RWOP_ERR_QUIT(rwops);
	if (0!=rwops->write(rwops,test_buf,1,1))			RWOP_ERR_QUIT(rwops); /* readonly mode */
	rwops->close(rwops);

/* test 3: same with w+ mode */
	rwops = SDL_RWFromFile(FBASENAME1,"wb+"); /* write + read + truncation */		
	if (!rwops)											RWOP_ERR_QUIT(rwops);
	if (1 != rwops->write(rwops,"1234567890",10,1) )	RWOP_ERR_QUIT(rwops);		
	if (10 != rwops->write(rwops,"1234567890",1,10) )	RWOP_ERR_QUIT(rwops);		
	if (7 != rwops->write(rwops,"1234567",1,7) )		RWOP_ERR_QUIT(rwops);		
	if (0!=rwops->seek(rwops,0L,RW_SEEK_SET))			RWOP_ERR_QUIT(rwops);					
	if (1!=rwops->read(rwops,test_buf,1,1))				RWOP_ERR_QUIT(rwops); /* we are in read/write mode */
	if (0!=rwops->seek(rwops,0L,RW_SEEK_SET))			RWOP_ERR_QUIT(rwops);					
	if (20!=rwops->seek(rwops,-7,RW_SEEK_END))			RWOP_ERR_QUIT(rwops);					
	if (7!=rwops->read(rwops,test_buf,1,7))				RWOP_ERR_QUIT(rwops);		
	if (SDL_memcmp(test_buf,"1234567",7))				RWOP_ERR_QUIT(rwops);		
	if (0!=rwops->read(rwops,test_buf,1,1))				RWOP_ERR_QUIT(rwops);		
	if (0!=rwops->read(rwops,test_buf,10,100))			RWOP_ERR_QUIT(rwops);		
	if (0!=rwops->seek(rwops,-27,RW_SEEK_CUR))			RWOP_ERR_QUIT(rwops);		
	if (2!=rwops->read(rwops,test_buf,10,3))			RWOP_ERR_QUIT(rwops);				
	if (SDL_memcmp(test_buf,"12345678901234567890",20))	RWOP_ERR_QUIT(rwops);
	rwops->close(rwops);
	printf("test3 OK\n");

/* test 4: same in r+ mode */
	rwops = SDL_RWFromFile(FBASENAME1,"rb+"); /* write + read + file must exists, no truncation */		
	if (!rwops)											RWOP_ERR_QUIT(rwops);
	if (1 != rwops->write(rwops,"1234567890",10,1) )	RWOP_ERR_QUIT(rwops);		
	if (10 != rwops->write(rwops,"1234567890",1,10) )	RWOP_ERR_QUIT(rwops);		
	if (7 != rwops->write(rwops,"1234567",1,7) )		RWOP_ERR_QUIT(rwops);		
	if (0!=rwops->seek(rwops,0L,RW_SEEK_SET))			RWOP_ERR_QUIT(rwops);					
	if (1!=rwops->read(rwops,test_buf,1,1))				RWOP_ERR_QUIT(rwops); /* we are in read/write mode */
	if (0!=rwops->seek(rwops,0L,RW_SEEK_SET))			RWOP_ERR_QUIT(rwops);					
	if (20!=rwops->seek(rwops,-7,RW_SEEK_END))			RWOP_ERR_QUIT(rwops);					
	if (7!=rwops->read(rwops,test_buf,1,7))				RWOP_ERR_QUIT(rwops);		
	if (SDL_memcmp(test_buf,"1234567",7))				RWOP_ERR_QUIT(rwops);		
	if (0!=rwops->read(rwops,test_buf,1,1))				RWOP_ERR_QUIT(rwops);		
	if (0!=rwops->read(rwops,test_buf,10,100))			RWOP_ERR_QUIT(rwops);		
	if (0!=rwops->seek(rwops,-27,RW_SEEK_CUR))			RWOP_ERR_QUIT(rwops);		
	if (2!=rwops->read(rwops,test_buf,10,3))			RWOP_ERR_QUIT(rwops);				
	if (SDL_memcmp(test_buf,"12345678901234567890",20))	RWOP_ERR_QUIT(rwops);
	rwops->close(rwops);
	printf("test4 OK\n");

/* test5 : append mode */
	rwops = SDL_RWFromFile(FBASENAME1,"ab+"); /* write + read + append */		
	if (!rwops)											RWOP_ERR_QUIT(rwops);
	if (1 != rwops->write(rwops,"1234567890",10,1) )	RWOP_ERR_QUIT(rwops);		
	if (10 != rwops->write(rwops,"1234567890",1,10) )	RWOP_ERR_QUIT(rwops);		
	if (7 != rwops->write(rwops,"1234567",1,7) )		RWOP_ERR_QUIT(rwops); 	
	if (0!=rwops->seek(rwops,0L,RW_SEEK_SET))			RWOP_ERR_QUIT(rwops);					
	
	if (1!=rwops->read(rwops,test_buf,1,1))				RWOP_ERR_QUIT(rwops); 
	if (0!=rwops->seek(rwops,0L,RW_SEEK_SET))			RWOP_ERR_QUIT(rwops);					
	
	if (20+27!=rwops->seek(rwops,-7,RW_SEEK_END))		RWOP_ERR_QUIT(rwops);					
	if (7!=rwops->read(rwops,test_buf,1,7))				RWOP_ERR_QUIT(rwops);		
	if (SDL_memcmp(test_buf,"1234567",7))				RWOP_ERR_QUIT(rwops);		
	if (0!=rwops->read(rwops,test_buf,1,1))				RWOP_ERR_QUIT(rwops);		
	if (0!=rwops->read(rwops,test_buf,10,100))			RWOP_ERR_QUIT(rwops);		
	
	if (27!=rwops->seek(rwops,-27,RW_SEEK_CUR))			RWOP_ERR_QUIT(rwops);
	
	if (0!=rwops->seek(rwops,0L,RW_SEEK_SET))			RWOP_ERR_QUIT(rwops);
	if (3!=rwops->read(rwops,test_buf,10,3))			RWOP_ERR_QUIT(rwops);				
	if (SDL_memcmp(test_buf,"123456789012345678901234567123",30))	
														RWOP_ERR_QUIT(rwops);
	rwops->close(rwops);
	printf("test5 OK\n");
	cleanup();
	return 0; /* all ok */
}